

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

int main(void)

{
  small_stats *psVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  char *pcVar7;
  undefined8 *__s1;
  code *extraout_RAX;
  code *pcVar8;
  uint uVar9;
  ulong uVar10;
  region *prVar11;
  uint uVar12;
  char *pcVar13;
  ulong extraout_RDX;
  slab_cache *psVar14;
  size_t sVar15;
  region *region_00;
  rlist *prVar16;
  slab_cache *size;
  slab_cache *psVar17;
  bool bVar18;
  region local_3a8;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_348;
  ulong local_90;
  ulong local_88;
  slab_cache *local_80;
  undefined1 local_78 [8];
  region region;
  
  plan(6);
  _space((FILE *)_stdout);
  local_88 = 0;
  printf("# *** %s ***\n","main");
  uVar5 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar5 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar5);
  quota.value = 0x40000000000000;
  uVar5 = 2;
  slab_arena_create(&arena,&quota,0,4000000,2);
  psVar14 = &cache;
  slab_cache_create(&cache,&arena);
  region_basic();
  region_test_truncate();
  region_test_callbacks();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_join");
  region.cache = (slab_cache *)&region;
  local_78 = (undefined1  [8])&cache;
  region.slabs.slabs.next = (rlist *)0x0;
  region.slabs.stats.used = 0;
  region.slabs.stats.total = 0;
  region.on_alloc_cb = (region_on_alloc_f)0x0;
  region.on_truncate_cb = (region_on_truncate_f)0x0;
  region.cb_arg = (void *)0x0;
  region.slabs.slabs.prev = (rlist *)region.cache;
  do {
    iVar3 = rand();
    uVar12 = iVar3 % 99;
    local_90 = (ulong)uVar12;
    if ((int)uVar12 < 0) {
      sVar15 = 0;
    }
    else {
      local_80 = (slab_cache *)(ulong)(uVar12 + 1);
      sVar15 = 0;
      psVar17 = (slab_cache *)0x0;
      do {
        iVar3 = rand();
        iVar3 = iVar3 % 0x309 + 1;
        if (iVar3 == 0) goto LAB_00104100;
        size = (slab_cache *)(long)iVar3;
        region.cb_arg = (void *)0x0;
        if ((((region *)region.slabs.slabs.prev == &region) &&
            ((slab_cache *)region.slabs.slabs.prev == region.cache)) ||
           ((slab_cache *)
            (ulong)((*(int *)&region.slabs.slabs.prev[1].prev -
                    *(uint *)&region.slabs.slabs.prev[2].prev) - 0x38) < size)) {
          pvVar6 = (void *)0x0;
        }
        else {
          pvVar6 = (void *)((long)&region.slabs.slabs.prev[2].next +
                           (ulong)*(uint *)&region.slabs.slabs.prev[2].prev);
        }
        if (pvVar6 == (void *)0x0) {
          pvVar6 = region_reserve_slow((region *)local_78,(size_t)size);
        }
        prVar16 = region.slabs.slabs.prev;
        uVar12 = (uint)uVar5;
        if (pvVar6 == (void *)0x0) {
          main_cold_1();
          pcVar8 = extraout_RAX;
          goto LAB_00104124;
        }
        region.cb_arg = (void *)0x1;
        if ((slab_cache *)
            (ulong)((*(int *)&region.slabs.slabs.prev[1].prev -
                    *(int *)&region.slabs.slabs.prev[2].prev) - 0x38) < size) goto LAB_001040e1;
        if (region.slabs.stats.total != 0) {
          (*(code *)region.slabs.stats.total)(local_78,size,region.on_truncate_cb);
        }
        region.slabs.slabs.next = (rlist *)((long)&(region.slabs.slabs.next)->prev + (long)size);
        *(int *)&prVar16[2].prev = *(int *)&prVar16[2].prev + iVar3;
        region.cb_arg = (void *)0x0;
        psVar14 = (slab_cache *)((long)&psVar17->arena + 1);
        memset(pvVar6,(int)psVar14,(size_t)size);
        (&local_3a8.cache)[(long)psVar17] = size;
        sVar15 = (long)size->orders + (sVar15 - 0x30);
        psVar17 = psVar14;
      } while (local_80 != psVar14);
    }
    pcVar7 = (char *)region_join((region *)local_78,sVar15);
    if (pcVar7 == (char *)0x0) {
      main_cold_9();
      goto LAB_00104151;
    }
    uVar5 = local_90;
    if (-1 < (int)local_90) {
      uVar5 = (ulong)((int)local_90 + 1);
      uVar10 = 0;
      do {
        if (0 < (long)(&local_3a8.cache)[uVar10]) {
          pcVar13 = pcVar7 + (long)(&local_3a8.cache)[uVar10];
          do {
            if (uVar10 + 1 != (ulong)(uint)(int)*pcVar7) {
              main_cold_2();
              goto LAB_001040e1;
            }
            pcVar7 = pcVar7 + 1;
          } while (pcVar7 < pcVar13);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar5);
    }
    uVar12 = (int)local_88 + 1;
    local_88 = (ulong)uVar12;
  } while (uVar12 != 0xd9);
  region_free((region *)local_78);
  psVar14 = (slab_cache *)0x0;
  _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
      0xbf,"line %d",0xbf);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","region_test_join");
  check_plan();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_alignment");
  local_3a8.slabs.slabs.prev = &local_3a8.slabs.slabs;
  local_3a8.cache = &cache;
  local_3a8.slabs.stats.used = 0;
  local_3a8.slabs.stats.total = 0;
  local_3a8.on_alloc_cb = (region_on_alloc_f)0x0;
  local_3a8.on_truncate_cb = (region_on_truncate_f)0x0;
  local_3a8.cb_arg = (void *)0x0;
  local_3a8.reserved = 0;
  iVar3 = 9999;
  local_3a8.slabs.slabs.next = local_3a8.slabs.slabs.prev;
  do {
    iVar4 = rand();
    sVar15 = local_3a8.slabs.stats.used;
    if (iVar4 % 7 == 1) {
      if ((psVar14 != (slab_cache *)0x0) &&
         (pvVar6 = region_join(&local_3a8,(size_t)psVar14), pvVar6 == (void *)0x0))
      goto LAB_00104160;
      psVar14 = (slab_cache *)0x0;
    }
    else if (iVar4 % 7 == 0) {
      iVar4 = rand();
      iVar4 = iVar4 % 0x14d + 1;
      if (iVar4 == 0) {
LAB_00104100:
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                      ,0xef,"void *region_alloc(struct region *, size_t)");
      }
      uVar5 = (ulong)iVar4;
      local_3a8.reserved = 0;
      local_80 = psVar14;
      if ((((slab_list *)local_3a8.slabs.slabs.next == &local_3a8.slabs) &&
          (local_3a8.slabs.slabs.next == local_3a8.slabs.slabs.prev)) ||
         ((*(int *)&local_3a8.slabs.slabs.next[1].prev - *(int *)&local_3a8.slabs.slabs.next[2].prev
          ) - 0x38 < uVar5)) {
        pvVar6 = region_reserve_slow(&local_3a8,uVar5);
        bVar18 = pvVar6 == (void *)0x0;
      }
      else {
        bVar18 = false;
      }
      prVar16 = local_3a8.slabs.slabs.next;
      if (bVar18) {
LAB_00104151:
        main_cold_4();
LAB_00104156:
        main_cold_5();
LAB_0010415b:
        main_cold_8();
LAB_00104160:
        main_cold_3();
        __assert_fail("!region->reserved",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                      ,0xda,"void *region_reserve(struct region *, size_t)");
      }
      local_3a8.reserved = 1;
      if ((*(int *)&local_3a8.slabs.slabs.next[1].prev - *(int *)&local_3a8.slabs.slabs.next[2].prev
          ) - 0x38 < uVar5) goto LAB_001040e1;
      if (local_3a8.on_alloc_cb != (region_on_alloc_f)0x0) {
        (*local_3a8.on_alloc_cb)(&local_3a8,uVar5,local_3a8.cb_arg);
      }
      local_3a8.slabs.stats.used = local_3a8.slabs.stats.used + uVar5;
      *(int *)&prVar16[2].prev = *(int *)&prVar16[2].prev + iVar4;
      local_3a8.reserved = 0;
      psVar14 = (slab_cache *)((long)&local_80->arena + uVar5);
    }
    else {
      iVar4 = rand();
      uVar5 = (ulong)(uint)(2 << ((char)iVar4 + (char)(iVar4 / 5) * -5 & 0x1fU));
      iVar4 = rand();
      pvVar6 = region_aligned_alloc(&local_3a8,(long)(iVar4 % 0x14d + 1),uVar5);
      if (pvVar6 == (void *)0x0) goto LAB_0010415b;
      if ((uVar5 - 1 & (ulong)pvVar6) != 0) goto LAB_00104156;
      psVar14 = (slab_cache *)((long)psVar14 + (local_3a8.slabs.stats.used - sVar15));
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  region_free(&local_3a8);
  uVar12 = 0x1060b7;
  _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
      0xea,"line %d",0xea);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","region_test_alignment");
  check_plan();
  plan(2);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_poison");
  local_78 = (undefined1  [8])&cache;
  region.cache = (slab_cache *)&region;
  region.on_truncate_cb = (region_on_truncate_f)0x0;
  region.cb_arg = (void *)0x0;
  region.slabs.slabs.next = (rlist *)0x0;
  region.slabs.stats.used = 0;
  region.slabs.stats.total = 0;
  region.on_alloc_cb = (region_on_alloc_f)0x0;
  local_358 = 0x5050505050505050;
  uStack_350 = 0x5050505050505050;
  local_3a8.reserved = 0x5050505050505050;
  uStack_360 = 0x5050505050505050;
  local_3a8.on_truncate_cb = (region_on_truncate_f)0x5050505050505050;
  local_3a8.cb_arg = (void *)0x5050505050505050;
  local_3a8.slabs.stats.total = 0x5050505050505050;
  local_3a8.on_alloc_cb = (region_on_alloc_f)0x5050505050505050;
  local_3a8.slabs.slabs.next = (rlist *)0x5050505050505050;
  local_3a8.slabs.stats.used = 0x5050505050505050;
  local_3a8.cache = (slab_cache *)0x5050505050505050;
  local_3a8.slabs.slabs.prev = (rlist *)0x5050505050505050;
  local_348 = 0x50505050;
  region_00 = (region *)local_78;
  sVar15 = 100;
  region.slabs.slabs.prev = (rlist *)region.cache;
  region_reserve_slow(region_00,100);
  region.cb_arg = (void *)0x0;
  prVar11 = &region;
  if (((region *)region.slabs.slabs.prev == prVar11) &&
     ((slab_cache *)region.slabs.slabs.prev == region.cache)) {
LAB_00103eaa:
    uVar9 = (uint)prVar11;
    psVar14 = (slab_cache *)0x0;
  }
  else {
    uVar9 = *(uint *)&region.slabs.slabs.prev[2].prev;
    prVar11 = (region *)(ulong)uVar9;
    if ((*(int *)&region.slabs.slabs.prev[1].prev - uVar9) - 0x38 < 10) goto LAB_00103eaa;
    psVar14 = (slab_cache *)((long)&prVar11->on_alloc_cb + (long)&(region.slabs.slabs.prev)->prev);
  }
  if (psVar14 == (slab_cache *)0x0) {
    region_00 = (region *)local_78;
    sVar15 = 10;
    psVar14 = (slab_cache *)region_reserve_slow(region_00,10);
  }
  if (psVar14 == (slab_cache *)0x0) {
    main_cold_7();
LAB_00104189:
    main_cold_6();
    uVar5 = 0x10000;
    if (0x10000 < uVar9) {
      uVar5 = (ulong)uVar9;
    }
    lVar2 = 0x3f;
    if (uVar5 - 1 != 0) {
      for (; uVar5 - 1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar10 = 1L << (-((byte)lVar2 ^ 0x3f) & 0x3f);
    region_00->cache = (slab_cache *)0x0;
    *(int *)&region_00->on_alloc_cb = (int)uVar10;
    (region_00->slabs).stats.total = sVar15;
    uVar5 = (ulong)*(uint *)(sVar15 + 4) << 10;
    if (extraout_RDX <= uVar5) {
      uVar5 = extraout_RDX;
    }
    uVar10 = uVar10 & 0xffffffff;
    prVar16 = (rlist *)(-uVar10 & (uVar5 + uVar10) - 1);
    (region_00->slabs).slabs.next = prVar16;
    (region_00->slabs).stats.used = 0;
    if ((int)uVar12 < 0) {
      if ((~uVar12 & 0x80000002) != 0 && (~uVar12 & 0x80000001) != 0) {
        __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      *(uint *)((long)&region_00->on_alloc_cb + 4) = uVar12;
    }
    else {
      if ((uVar12 & 3) == 0) {
        __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      if (uVar12 == 2) {
        *(undefined4 *)((long)&region_00->on_alloc_cb + 4) = 0x80000001;
      }
      else {
        *(undefined4 *)((long)&region_00->on_alloc_cb + 4) = 0x80000002;
      }
    }
    iVar3 = 0;
    if (prVar16 == (rlist *)0x0) {
      prVar16 = (rlist *)0x0;
    }
    else {
      prVar16 = (rlist *)mmap_checked((size_t)prVar16,uVar10,
                                      *(int *)((long)&region_00->on_alloc_cb + 4));
    }
    (region_00->slabs).slabs.prev = prVar16;
    madvise_checked(prVar16,(size_t)(region_00->slabs).slabs.next,
                    *(int *)((long)&region_00->on_alloc_cb + 4));
    if ((region_00->slabs).slabs.next != (rlist *)0x0) {
      iVar3 = -(uint)((region_00->slabs).slabs.prev == (rlist *)0x0);
    }
    return iVar3;
  }
  region.cb_arg = (void *)0x1;
  if (9 < (*(int *)&region.slabs.slabs.prev[1].prev - *(int *)&region.slabs.slabs.prev[2].prev) -
          0x38U) {
    pcVar8 = (code *)region.slabs.stats.total;
    psVar17 = (slab_cache *)region.slabs.slabs.prev;
    if (region.slabs.stats.total != 0) {
LAB_00104124:
      region_00 = (region *)local_78;
      sVar15 = 10;
      (*pcVar8)(region_00,10,region.on_truncate_cb);
    }
    region.slabs.slabs.next = (rlist *)((long)&(region.slabs.slabs.next)->next + 2);
    psVar1 = &(psVar17->allocated).stats;
    *(int *)&psVar1->used = (int)psVar1->used + 10;
    __s1 = (undefined8 *)0x0;
    psVar14->arena = (slab_arena *)0x0;
    *(undefined2 *)&psVar14->order0_size = 0;
    region.cb_arg = (void *)0x0;
    prVar11 = &region;
    if (((region *)region.slabs.slabs.prev != prVar11) ||
       ((slab_cache *)region.slabs.slabs.prev != region.cache)) {
      prVar11 = (region *)(ulong)*(uint *)&region.slabs.slabs.prev[2].prev;
      if ((*(int *)&region.slabs.slabs.prev[1].prev - *(uint *)&region.slabs.slabs.prev[2].prev) -
          0x38 < 0x5a) {
        __s1 = (undefined8 *)0x0;
      }
      else {
        __s1 = (undefined8 *)((long)&prVar11->on_alloc_cb + (long)&(region.slabs.slabs.prev)->prev);
      }
    }
    uVar9 = (uint)prVar11;
    if (__s1 == (undefined8 *)0x0) {
      region_00 = (region *)local_78;
      sVar15 = 0x5a;
      __s1 = (undefined8 *)region_reserve_slow(region_00,0x5a);
    }
    prVar16 = region.slabs.slabs.prev;
    if (__s1 == (undefined8 *)0x0) goto LAB_00104189;
    region.cb_arg = (void *)0x1;
    if (0x59 < (*(int *)&region.slabs.slabs.prev[1].prev - *(int *)&region.slabs.slabs.prev[2].prev)
               - 0x38U) {
      if (region.slabs.stats.total != 0) {
        (*(code *)region.slabs.stats.total)(local_78,0x5a,region.on_truncate_cb);
      }
      *(int *)&prVar16[2].prev = *(int *)&prVar16[2].prev + 0x5a;
      region.cb_arg = (void *)0x0;
      *(undefined8 *)((long)__s1 + 0x4a) = 0;
      *(undefined8 *)((long)__s1 + 0x52) = 0;
      __s1[8] = 0;
      __s1[9] = 0;
      __s1[6] = 0;
      __s1[7] = 0;
      __s1[4] = 0;
      __s1[5] = 0;
      __s1[2] = 0;
      __s1[3] = 0;
      *__s1 = 0;
      __s1[1] = 0;
      region.slabs.slabs.next = (rlist *)((long)&region.slabs.slabs.next[5].next + 2);
      region_truncate((region *)local_78,10);
      iVar3 = bcmp(__s1,&local_3a8,0x5a);
      _ok((uint)(iVar3 == 0),"memcmp(ptr2, pattern, 90) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",0x107,
          "line %d",0x107);
      region_truncate((region *)local_78,0);
      _ok((uint)((short)psVar14->order0_size == (short)local_3a8.slabs.slabs.prev &&
                (slab_cache *)psVar14->arena == local_3a8.cache),"memcmp(ptr1, pattern, 10) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",0x10a,
          "line %d",0x10a);
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","region_test_poison");
      check_plan();
      slab_cache_destroy(&cache);
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","main");
      iVar3 = check_plan();
      return iVar3;
    }
  }
LAB_001040e1:
  __assert_fail("size <= rslab_unused(slab)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                ,0xf8,"void *region_alloc(struct region *, size_t)");
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(8);
#else
#ifndef NDEBUG
	plan(6);
#else
	plan(5);
#endif
#endif
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	region_basic();
	region_test_truncate();
	region_test_callbacks();
	region_test_join();
	region_test_alignment();
#ifndef ENABLE_ASAN
#ifndef NDEBUG
	region_test_poison();
#endif
#else
	region_test_poison();
	region_test_tiny_reserve_size();
	region_test_truncate_reserved();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}